

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ModifyAfterWithMapBufferFlushCase::
ModifyAfterWithMapBufferFlushCase
          (ModifyAfterWithMapBufferFlushCase *this,Context *context,char *name,char *desc,
          int bufferSizeMin,int bufferSizeMax,deUint32 usage,int flags,deUint32 glMapFlags)

{
  undefined8 *puVar1;
  deUint64 *pdVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  deUint64 dVar7;
  deUint64 dVar8;
  deUint64 dVar9;
  deUint64 dVar10;
  deUint64 dVar11;
  uint uVar12;
  value_type_conflict1 *__val;
  pointer piVar13;
  pointer pUVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  float fVar18;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,NODETYPE_PERFORMANCE,name,desc);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .super_TestCase.m_context = context;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicBufferCase_021a0f40;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_dummyProgram = (ShaderProgram *)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_dummyProgramPosLoc = -1;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_bufferID = 0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_numSamples = 0x14;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_bufferSizeMin = 0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_bufferSizeMax = 0x1000000;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_allocateLargerBuffer = false;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_iteration = 0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_iterationOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_iterationOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_iterationOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar13 = (pointer)operator_new(0x50);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_iterationOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = piVar13;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_iterationOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar13;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_iterationOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar13 + 0x14;
  piVar13[0x10] = 0;
  piVar13[0x11] = 0;
  piVar13[0x12] = 0;
  piVar13[0x13] = 0;
  piVar13[0xc] = 0;
  piVar13[0xd] = 0;
  piVar13[0xe] = 0;
  piVar13[0xf] = 0;
  piVar13[8] = 0;
  piVar13[9] = 0;
  piVar13[10] = 0;
  piVar13[0xb] = 0;
  piVar13[4] = 0;
  piVar13[5] = 0;
  piVar13[6] = 0;
  piVar13[7] = 0;
  piVar13[0] = 0;
  piVar13[1] = 0;
  piVar13[2] = 0;
  piVar13[3] = 0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_iterationOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar13 + 0x14;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pUVar14 = (pointer)operator_new(0x500);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pUVar14;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pUVar14;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar14 + 0x14;
  (pUVar14->duration).totalDuration = 0;
  (pUVar14->duration).fitResponseDuration = 0;
  (pUVar14->duration).writeDuration = 0;
  (pUVar14->duration).flushDuration = 0;
  (pUVar14->duration).mapDuration = 0;
  (pUVar14->duration).unmapDuration = 0;
  pUVar14->bufferSize = 0;
  pUVar14->allocatedSize = 0;
  *(undefined8 *)&pUVar14->writtenSize = 0;
  lVar16 = 0x40;
  do {
    uVar5 = *(undefined8 *)pUVar14;
    uVar6 = *(undefined8 *)&pUVar14->writtenSize;
    dVar7 = (pUVar14->duration).mapDuration;
    dVar8 = (pUVar14->duration).unmapDuration;
    dVar9 = (pUVar14->duration).writeDuration;
    dVar10 = (pUVar14->duration).flushDuration;
    dVar11 = (pUVar14->duration).fitResponseDuration;
    pdVar2 = (deUint64 *)((long)&(pUVar14->duration).totalDuration + lVar16);
    *pdVar2 = (pUVar14->duration).totalDuration;
    pdVar2[1] = dVar11;
    pdVar2 = (deUint64 *)((long)&(pUVar14->duration).writeDuration + lVar16);
    *pdVar2 = dVar9;
    pdVar2[1] = dVar10;
    pdVar2 = (deUint64 *)((long)&(pUVar14->duration).mapDuration + lVar16);
    *pdVar2 = dVar7;
    pdVar2[1] = dVar8;
    puVar1 = (undefined8 *)((long)&pUVar14->bufferSize + lVar16);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    lVar16 = lVar16 + 0x40;
  } while (lVar16 != 0x500);
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_results.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pUVar14 + 0x14;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_useGL = true;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .m_bufferRandomizerTimer = 0;
  generateTwoPassRandomIterationOrder
            (&(this->
              super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
              ).
              super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
              .m_iterationOrder,
             (this->
             super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
             .m_numSamples);
  iVar4 = (this->
          super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
          ).
          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
          .m_numSamples;
  if (0 < (long)iVar4) {
    bVar3 = (this->
            super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ).
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            .m_allocateLargerBuffer;
    pUVar14 = (this->
              super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
              ).
              super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
              .m_results.
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar17 = 1;
    lVar16 = 0;
    do {
      fVar18 = floorf(((float)iVar17 / (float)iVar4) * 16777216.0 + 0.0);
      uVar12 = (int)fVar18 + 0xfU & 0xfffffff0;
      uVar15 = (int)((float)(int)uVar12 * 1.5);
      if (bVar3 == false) {
        uVar15 = uVar12;
      }
      *(uint *)((long)&pUVar14->bufferSize + lVar16) = uVar12;
      *(uint *)((long)&pUVar14->allocatedSize + lVar16) = uVar15 + 0xf & 0xfffffff0;
      *(undefined4 *)((long)&pUVar14->writtenSize + lVar16) = 0xffffffff;
      lVar16 = lVar16 + 0x40;
      iVar17 = iVar17 + 1;
    } while ((long)iVar4 * 0x40 != lVar16);
  }
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).m_unmappingErrors = 0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).m_bufferUnspecifiedAfterTest = false;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).m_bufferUsage = bufferSizeMin;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ).
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ModifyAfterWithMapBufferFlushCase_021a0e58;
  this->m_partialUpload = (bool)((byte)bufferSizeMax & 1);
  this->m_mapFlags = 0x12;
  return;
}

Assistant:

ModifyAfterWithMapBufferFlushCase::ModifyAfterWithMapBufferFlushCase (Context& context, const char* name, const char* desc, int bufferSizeMin, int bufferSizeMax, deUint32 usage, int flags, deUint32 glMapFlags)
	: ModifyAfterBasicCase<MapBufferRangeFlushDurationNoAlloc>	(context, name, desc, bufferSizeMin, bufferSizeMax, usage, isBufferUnspecifiedAfterUpload(flags, glMapFlags))
	, m_partialUpload											((flags & FLAG_PARTIAL) != 0)
	, m_mapFlags												(glMapFlags)
{
}